

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-file.c
# Opt level: O0

void file_get_tempfile(char *filename,size_t max,char *base,char *ext)

{
  char *ext_local;
  char *base_local;
  size_t max_local;
  char *filename_local;
  
  strnfmt(filename,max,"%s.%s",base,ext);
  return;
}

Assistant:

void file_get_tempfile(char *filename, size_t max, const char *base,
	const char *ext)
{
#ifdef DJGPP
	/* DOS needs a shorter file name */
        strnfmt(filename, max, "%s/temp.%s", dirname(base), ext);
#else
        strnfmt(filename, max, "%s.%s", base, ext);
#endif
	return;
}